

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

void jpgd::jpeg_decoder::decode_block_dc_first
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  uint uVar1;
  jpeg_decoder *this;
  int in_ECX;
  int in_EDX;
  uint uVar2;
  int in_ESI;
  jpeg_decoder *in_RDI;
  jpgd_block_t *p;
  int r;
  int s;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint local_18;
  
  this = (jpeg_decoder *)coeff_buf_getp(in_RDI,in_RDI->m_dc_coeffs[in_ESI],in_EDX,in_ECX);
  uVar1 = huff_decode((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (huff_tables *)this);
  local_18 = uVar1;
  if ((uVar1 != 0) &&
     (local_18 = get_bits_no_markers(this,in_stack_ffffffffffffffd4),
     (int)local_18 < *(int *)(s_extend_test + (long)(int)(uVar1 & 0xf) * 4))) {
    local_18 = local_18 + *(int *)(s_extend_offset + (long)(int)(uVar1 & 0xf) * 4);
  }
  uVar2 = in_RDI->m_last_dc_val[in_ESI] + local_18;
  in_RDI->m_last_dc_val[in_ESI] = uVar2;
  *(short *)this->m_jmp_state[0].__jmpbuf =
       (short)(uVar2 << ((byte)in_RDI->m_successive_low & 0x1f));
  return;
}

Assistant:

void jpeg_decoder::decode_block_dc_first(jpeg_decoder* pD, int component_id, int block_x, int block_y) {
  int s, r;
  jpgd_block_t* p = pD->coeff_buf_getp(pD->m_dc_coeffs[component_id], block_x, block_y);

  if ((s = pD->huff_decode(pD->m_pHuff_tabs[pD->m_comp_dc_tab[component_id]])) != 0) {
    r = pD->get_bits_no_markers(s);
    s = JPGD_HUFF_EXTEND(r, s);
  }

  pD->m_last_dc_val[component_id] = (s += pD->m_last_dc_val[component_id]);

  p[0] = static_cast<jpgd_block_t>(s << pD->m_successive_low);
}